

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O3

qint64 anon_unknown.dwarf_3eed5a::secondsBetween(tm *start,tm *stop)

{
  long in_FS_OFFSET;
  tm from;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  char *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  matchYearMonth((tm *)&local_58,*start,stop);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return ((long)stop->tm_sec - (long)(int)local_58) +
           (((long)stop->tm_min - (long)local_58._4_4_) +
           ((((long)stop->tm_mday - (long)uStack_50._4_4_) * 0x18 + (long)stop->tm_hour) -
           (long)(int)uStack_50) * 0x3c) * 0x3c;
  }
  __stack_chk_fail();
}

Assistant:

Q_DECL_COLD_FUNCTION
qint64 secondsBetween(const struct tm &start, const struct tm &stop)
{
    // Nominal difference between start and stop, in seconds (negative if start
    // is after stop); may differ from actual UTC difference if there's a
    // transition between them.
    struct tm from = matchYearMonth(start, stop);
    qint64 diff = stop.tm_mday - from.tm_mday; // in days
    diff = diff * 24 + stop.tm_hour - from.tm_hour; // in hours
    diff = diff * 60 + stop.tm_min - from.tm_min; // in minutes
    return diff * 60 + stop.tm_sec - from.tm_sec; // in seconds
}